

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int utf8_line_count(utf8_char_t *data)

{
  size_t len;
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  do {
    sVar1 = utf8_line_length(data);
    data = data + sVar1;
    iVar2 = iVar2 + 1;
  } while (sVar1 != 0);
  return iVar2;
}

Assistant:

int utf8_line_count(const utf8_char_t* data)
{
    size_t len = 0;
    int count = 0;

    do {
        len = utf8_line_length(data);
        data += len;
        ++count;
    } while (0 < len);

    return count - 1;
}